

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.hpp
# Opt level: O2

HLSLTokenInfo *
Diligent::Parsing::HLSLTokenInfo::Create
          (HLSLTokenInfo *__return_storage_ptr__,TokenType _Type,const_iterator *DelimStart,
          const_iterator *DelimEnd,const_iterator *LiteralStart,const_iterator *LiteralEnd,
          size_t Idx)

{
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_60,LiteralStart->_M_current,LiteralEnd->_M_current);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_40,DelimStart->_M_current,DelimEnd->_M_current);
  HLSLTokenInfo(__return_storage_ptr__,_Type,&local_60,&local_40,Idx);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

static HLSLTokenInfo Create(TokenType                          _Type,
                                const std::string::const_iterator& DelimStart,
                                const std::string::const_iterator& DelimEnd,
                                const std::string::const_iterator& LiteralStart,
                                const std::string::const_iterator& LiteralEnd,
                                size_t                             Idx)
    {
        return HLSLTokenInfo{_Type, std::string{LiteralStart, LiteralEnd}, std::string{DelimStart, DelimEnd}, Idx};
    }